

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::Encode
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,
          KDataStream *stream)

{
  (*(this->m_X).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_X);
  (*(this->m_Y).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Y,stream);
  (*(this->m_Z).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Z,stream);
  return;
}

Assistant:

void LE_Vector<Type>::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_X
           << KDIS_STREAM m_Y
           << KDIS_STREAM m_Z;
}